

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_CallFlowGraph.h
# Opt level: O2

void __thiscall
soul::CallFlowGraph::PreviousCall::findCallSequenceUpTo
          (PreviousCall *this,Function *f,
          vector<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
          *sequence)

{
  value_type local_20;
  
  local_20.object = this->function;
  std::
  vector<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
  ::_M_insert_rval(sequence,(sequence->
                            super__Vector_base<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,&local_20);
  if ((this->previous != (PreviousCall *)0x0) && (this->function != f)) {
    findCallSequenceUpTo(this->previous,f,sequence);
  }
  return;
}

Assistant:

void findCallSequenceUpTo (heart::Function& f, std::vector<pool_ref<heart::Function>>& sequence) const
        {
            sequence.insert (sequence.begin(), function);

            if (previous != nullptr && std::addressof (f) != std::addressof (function))
                previous->findCallSequenceUpTo (f, sequence);
        }